

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O0

bool __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,weighted_vec_array *weighted_vecs,
          uint max_clusters,vector<crnlib::vector<unsigned_int>_> *cluster_indices,
          progress_callback_func pProgress_callback,void *pProgress_callback_data)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  crn_thread_id_t cVar4;
  uint *puVar5;
  vector<unsigned_int> *this_00;
  vector<unsigned_int> *other;
  training_vec_array *this_01;
  weighted_vec *v_00;
  vector<unsigned_int> *local_280;
  create_clusters_task_state *local_268;
  create_clusters_task_state *local_200;
  vector<unsigned_int> *local_1e0;
  uint num_clusters;
  weighted_vec *v;
  uint local_1a8;
  uint i_5;
  uint j;
  uint ofs;
  uint i_4;
  uint i_3;
  uint total_clusters;
  uint local_178;
  uint num_indices_1;
  uint i_2;
  uint num_indices;
  uint i_1;
  uint total_partitions;
  create_clusters_task_state task_state [4];
  vector<unsigned_int> indices [6];
  uint local_54;
  undefined1 local_50 [4];
  uint i;
  vector<unsigned_int> primary_indices;
  void *pProgress_callback_data_local;
  progress_callback_func pProgress_callback_local;
  vector<crnlib::vector<unsigned_int>_> *cluster_indices_local;
  uint max_clusters_local;
  weighted_vec_array *weighted_vecs_local;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *this_local;
  
  primary_indices._8_8_ = pProgress_callback_data;
  cVar4 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar4;
  this->m_canceled = false;
  this->m_pProgress_callback = pProgress_callback;
  this->m_pProgress_callback_data = (void *)primary_indices._8_8_;
  if (max_clusters < 0x80) {
    clusterizer<crnlib::vec<16U,_float>_>::clear(this->m_clusterizers);
    this_01 = clusterizer<crnlib::vec<16U,_float>_>::get_training_vecs(this->m_clusterizers);
    uVar2 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                      (weighted_vecs);
    vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::reserve(this_01,uVar2);
    for (v._4_4_ = 0;
        uVar2 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                          (weighted_vecs), v._4_4_ < uVar2; v._4_4_ = v._4_4_ + 1) {
      v_00 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
             operator[](weighted_vecs,v._4_4_);
      clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
                (this->m_clusterizers,&v_00->m_vec,v_00->m_weight);
    }
    clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
              (this->m_clusterizers,max_clusters,generate_codebook_progress_callback,this,false);
    uVar2 = clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size(this->m_clusterizers);
    clusterizer<crnlib::vec<16U,_float>_>::retrieve_clusters
              (this->m_clusterizers,uVar2,cluster_indices);
  }
  else {
    uVar2 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                      (weighted_vecs);
    vector<unsigned_int>::vector((vector<unsigned_int> *)local_50,uVar2);
    for (local_54 = 0;
        uVar2 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                          (weighted_vecs), local_54 < uVar2; local_54 = local_54 + 1) {
      puVar5 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_50,local_54);
      *puVar5 = local_54;
    }
    local_1e0 = (vector<unsigned_int> *)&task_state[3].m_max_clusters;
    do {
      vector<unsigned_int>::vector(local_1e0);
      local_1e0 = local_1e0 + 1;
    } while (local_1e0 != (vector<unsigned_int> *)&indices[5].m_size);
    compute_split(this,weighted_vecs,(vector<unsigned_int> *)local_50,
                  (vector<unsigned_int> *)&task_state[3].m_max_clusters,
                  (vector<unsigned_int> *)&indices[0].m_size);
    compute_split(this,weighted_vecs,(vector<unsigned_int> *)&task_state[3].m_max_clusters,
                  (vector<unsigned_int> *)&indices[1].m_size,
                  (vector<unsigned_int> *)&indices[2].m_size);
    compute_split(this,weighted_vecs,(vector<unsigned_int> *)&indices[0].m_size,
                  (vector<unsigned_int> *)&indices[3].m_size,
                  (vector<unsigned_int> *)&indices[4].m_size);
    local_200 = (create_clusters_task_state *)&i_1;
    do {
      create_clusters_task_state::create_clusters_task_state(local_200);
      local_200 = local_200 + 1;
    } while (local_200 != (create_clusters_task_state *)&task_state[3].m_max_clusters);
    this->m_cluster_task_displayed_progress = false;
    num_indices = 0;
    for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
      uVar2 = vector<unsigned_int>::size
                        ((vector<unsigned_int> *)&indices[(ulong)(i_2 + 2) - 1].m_size);
      if (uVar2 != 0) {
        num_indices = num_indices + 1;
      }
    }
    for (local_178 = 0; local_178 < 4; local_178 = local_178 + 1) {
      uVar2 = vector<unsigned_int>::size
                        ((vector<unsigned_int> *)&indices[(ulong)(local_178 + 2) - 1].m_size);
      if (uVar2 != 0) {
        *(weighted_vec_array **)(&i_1 + (ulong)local_178 * 10) = weighted_vecs;
        task_state[local_178].m_pWeighted_vecs =
             (weighted_vec_array *)&indices[(ulong)(local_178 + 2) - 1].m_size;
        task_state[local_178].m_cluster_indices.m_size =
             (max_clusters + (num_indices >> 1)) / num_indices;
        task_pool::
        queue_object_task<crnlib::threaded_clusterizer<crnlib::vec<16u,float>>,void(crnlib::threaded_clusterizer<crnlib::vec<16u,float>>::*)(unsigned_long_long,void*)>
                  (this->m_pTask_pool,this,0x163b10,0,(void *)(ulong)local_178);
      }
    }
    task_pool::join(this->m_pTask_pool);
    if ((this->m_canceled & 1U) == 0) {
      i_4 = 0;
      for (ofs = 0; ofs < 4; ofs = ofs + 1) {
        uVar2 = vector<crnlib::vector<unsigned_int>_>::size
                          ((vector<crnlib::vector<unsigned_int>_> *)&task_state[ofs].m_pIndices);
        i_4 = uVar2 + i_4;
      }
      vector<crnlib::vector<unsigned_int>_>::reserve(cluster_indices,i_4);
      vector<crnlib::vector<unsigned_int>_>::resize(cluster_indices,0,false);
      for (j = 0; j < 4; j = j + 1) {
        uVar2 = vector<crnlib::vector<unsigned_int>_>::size(cluster_indices);
        uVar3 = vector<crnlib::vector<unsigned_int>_>::size
                          ((vector<crnlib::vector<unsigned_int>_> *)&task_state[j].m_pIndices);
        vector<crnlib::vector<unsigned_int>_>::resize(cluster_indices,uVar2 + uVar3,false);
        for (local_1a8 = 0;
            uVar3 = vector<crnlib::vector<unsigned_int>_>::size
                              ((vector<crnlib::vector<unsigned_int>_> *)&task_state[j].m_pIndices),
            local_1a8 < uVar3; local_1a8 = local_1a8 + 1) {
          this_00 = vector<crnlib::vector<unsigned_int>_>::operator[]
                              (cluster_indices,uVar2 + local_1a8);
          other = vector<crnlib::vector<unsigned_int>_>::operator[]
                            ((vector<crnlib::vector<unsigned_int>_> *)&task_state[j].m_pIndices,
                             local_1a8);
          vector<unsigned_int>::swap(this_00,other);
        }
      }
      bVar1 = false;
    }
    else {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    local_268 = (create_clusters_task_state *)&task_state[3].m_max_clusters;
    do {
      local_268 = local_268 + -1;
      create_clusters_task_state::~create_clusters_task_state(local_268);
    } while (local_268 != (create_clusters_task_state *)&i_1);
    local_280 = (vector<unsigned_int> *)&indices[5].m_size;
    do {
      local_280 = local_280 + -1;
      vector<unsigned_int>::~vector(local_280);
    } while (local_280 != (vector<unsigned_int> *)&task_state[3].m_max_clusters);
    vector<unsigned_int>::~vector((vector<unsigned_int> *)local_50);
    if (bVar1) goto LAB_0015ce08;
  }
  this_local._7_1_ = (this->m_canceled ^ 0xffU) & 1;
LAB_0015ce08:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool create_clusters(
            const weighted_vec_array& weighted_vecs,
            uint max_clusters, crnlib::vector<crnlib::vector<uint> >& cluster_indices,
            progress_callback_func pProgress_callback,
            void* pProgress_callback_data)
        {
            m_main_thread_id = crn_get_current_thread_id();
            m_canceled = false;
            m_pProgress_callback = pProgress_callback;
            m_pProgress_callback_data = pProgress_callback_data;

            if (max_clusters >= 128)
            {
                crnlib::vector<uint> primary_indices(weighted_vecs.size());
                for (uint i = 0; i < weighted_vecs.size(); i++)
                {
                    primary_indices[i] = i;
                }

                CRNLIB_ASSUME(cMaxClusterizers == 4);

                crnlib::vector<uint> indices[6];

                compute_split(weighted_vecs, primary_indices, indices[0], indices[1]);
                compute_split(weighted_vecs, indices[0], indices[2], indices[3]);
                compute_split(weighted_vecs, indices[1], indices[4], indices[5]);

                create_clusters_task_state task_state[4];

                m_cluster_task_displayed_progress = false;

                uint total_partitions = 0;
                for (uint i = 0; i < 4; i++)
                {
                    const uint num_indices = indices[2 + i].size();
                    if (num_indices)
                    {
                        total_partitions++;
                    }
                }

                for (uint i = 0; i < 4; i++)
                {
                    const uint num_indices = indices[2 + i].size();
                    if (!num_indices)
                    {
                        continue;
                    }

                    task_state[i].m_pWeighted_vecs = &weighted_vecs;
                    task_state[i].m_pIndices = &indices[2 + i];
                    task_state[i].m_max_clusters = (max_clusters + (total_partitions / 2)) / total_partitions;

                    m_pTask_pool->queue_object_task(this, &threaded_clusterizer::create_clusters_task, i, &task_state[i]);
                }

                m_pTask_pool->join();

                if (m_canceled)
                {
                    return false;
                }

                uint total_clusters = 0;
                for (uint i = 0; i < 4; i++)
                {
                    total_clusters += task_state[i].m_cluster_indices.size();
                }

                cluster_indices.reserve(total_clusters);
                cluster_indices.resize(0);

                for (uint i = 0; i < 4; i++)
                {
                    const uint ofs = cluster_indices.size();

                    cluster_indices.resize(ofs + task_state[i].m_cluster_indices.size());

                    for (uint j = 0; j < task_state[i].m_cluster_indices.size(); j++)
                    {
                        cluster_indices[ofs + j].swap(task_state[i].m_cluster_indices[j]);
                    }
                }
            }
            else
            {
                m_clusterizers[0].clear();
                m_clusterizers[0].get_training_vecs().reserve(weighted_vecs.size());

                for (uint i = 0; i < weighted_vecs.size(); i++)
                {
                    const weighted_vec& v = weighted_vecs[i];

                    m_clusterizers[0].add_training_vec(v.m_vec, v.m_weight);
                }

                m_clusterizers[0].generate_codebook(max_clusters, generate_codebook_progress_callback, this, false);  //m_params.m_dxt_quality <= cCRNDXTQualityFast);

                const uint num_clusters = m_clusterizers[0].get_codebook_size();

                m_clusterizers[0].retrieve_clusters(num_clusters, cluster_indices);
            }

            return !m_canceled;
        }